

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# particles.c
# Opt level: O0

void update_particle(PARTICLE *p,float dt)

{
  float dt_local;
  PARTICLE *p_local;
  
  if (p->active != 0) {
    p->life = -dt * 0.125 + p->life;
    if (0.0 < p->life) {
      p->vz = dt * -9.8 + p->vz;
      p->x = p->vx * dt + p->x;
      p->y = p->vy * dt + p->y;
      p->z = p->vz * dt + p->z;
      if (p->vz <= 0.0 && p->vz != 0.0) {
        if ((3.8025002 <= p->x * p->x + p->y * p->y) || (3.35 < p->z || p->z == 3.35)) {
          if (p->z <= 0.35 && p->z != 0.35) {
            p->vz = p->vz * -0.75;
            p->z = (0.35 - p->z) * 0.75 + 0.35;
          }
        }
        else {
          p->vz = p->vz * -0.75;
          p->z = (3.35 - p->z) * 0.75 + 3.35;
        }
      }
    }
    else {
      p->active = 0;
    }
  }
  return;
}

Assistant:

static void update_particle(PARTICLE *p, float dt)
{
    // If the particle is not active, we need not do anything
    if (!p->active)
        return;

    // The particle is getting older...
    p->life -= dt * (1.f / LIFE_SPAN);

    // Did the particle die?
    if (p->life <= 0.f)
    {
        p->active = 0;
        return;
    }

    // Apply gravity
    p->vz = p->vz - GRAVITY * dt;

    // Update particle position
    p->x = p->x + p->vx * dt;
    p->y = p->y + p->vy * dt;
    p->z = p->z + p->vz * dt;

    // Simple collision detection + response
    if (p->vz < 0.f)
    {
        // Particles should bounce on the fountain (with friction)
        if ((p->x * p->x + p->y * p->y) < FOUNTAIN_R2 &&
            p->z < (FOUNTAIN_HEIGHT + PARTICLE_SIZE / 2))
        {
            p->vz = -FRICTION * p->vz;
            p->z  = FOUNTAIN_HEIGHT + PARTICLE_SIZE / 2 +
                    FRICTION * (FOUNTAIN_HEIGHT +
                    PARTICLE_SIZE / 2 - p->z);
        }

        // Particles should bounce on the floor (with friction)
        else if (p->z < PARTICLE_SIZE / 2)
        {
            p->vz = -FRICTION * p->vz;
            p->z  = PARTICLE_SIZE / 2 +
                    FRICTION * (PARTICLE_SIZE / 2 - p->z);
        }
    }
}